

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  CommandLine<Catch::ConfigData> *in_RDI;
  allocator local_124;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  value_type local_120;
  string local_100 [32];
  value_type local_e0;
  string local_c0 [32];
  ArgBinder binder;
  
  Clara::CommandLine<Catch::ConfigData>::CommandLine(in_RDI);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
            (in_RDI,0x78);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,6);
  std::__cxx11::string::string(local_100,"display usage information",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"?",&local_124);
  this = &binder.m_arg.shortNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"h",&local_121);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,&local_e0);
  std::__cxx11::string::string(local_c0,"help",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,0);
  std::__cxx11::string::string(local_100,"list all (or matching) test cases",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"l",&local_123);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"list-tests",&local_124);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,1);
  std::__cxx11::string::string(local_100,"list all (or matching) tags",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"t",&local_123);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"list-tags",&local_124);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,2);
  std::__cxx11::string::string(local_100,"list all reporters",(allocator *)&local_e0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"list-reporters",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,3);
  std::__cxx11::string::string(local_100,"include successful tests in output",(allocator *)local_c0)
  ;
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"s",&local_123);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"success",&local_124);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,4);
  std::__cxx11::string::string(local_100,"break into debugger on failure",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"b",&local_123);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"break",&local_124);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<bool_Catch::ConfigData::*>
            (&binder,in_RDI,5);
  std::__cxx11::string::string(local_100,"skip exception tests",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"e",&local_123);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"nothrow",&local_124);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::
  ArgBinder<std::__cxx11::string_Catch::ConfigData::*>(&binder,in_RDI,0x38);
  std::__cxx11::string::string(local_100,"output filename",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"o",&local_124);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"out",&local_121);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::string(local_c0,"filename",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::
  ArgBinder<std::__cxx11::string_Catch::ConfigData::*>(&binder,in_RDI,0x18);
  std::__cxx11::string::string(local_100,"reporter to use - defaults to console",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"r",&local_124);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"reporter",&local_121);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::string(local_c0,"name",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::
  ArgBinder<std::__cxx11::string_Catch::ConfigData::*>(&binder,in_RDI,0x58);
  std::__cxx11::string::string(local_100,"suite name",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"n",&local_124);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"name",&local_121);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::string(local_c0,"name",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<void(*)(Catch::ConfigData&)>
            (&binder,in_RDI,abortAfterFirst);
  std::__cxx11::string::string(local_100,"abort at first failure",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"a",&local_123);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"abort",&local_124);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<void(*)(Catch::ConfigData&,int)>
            (&binder,in_RDI,abortAfterX);
  std::__cxx11::string::string(local_100,"abort after x failures",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"x",&local_124);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"abortx",&local_121);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::string(local_c0,"number of failures",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::
  ArgBinder<void(*)(Catch::ConfigData&,std::__cxx11::string_const&)>(&binder,in_RDI,addWarning);
  std::__cxx11::string::string(local_100,"enable warnings",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"w",&local_124);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"warn",&local_121);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::string(local_c0,"warning name",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::
  ArgBinder<void(*)(Catch::ConfigData&,std::__cxx11::string_const&)>(&binder,in_RDI,addTestOrTags);
  std::__cxx11::string::string(local_100,"which test or tests to use",(allocator *)&local_e0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string
            ((string *)&local_120,"test name, pattern or tags",(allocator *)local_c0);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::ArgBinder<void(*)(Catch::ConfigData&,bool)>
            (&binder,in_RDI,setShowDurations);
  std::__cxx11::string::string(local_100,"show test durations",&local_123);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.description);
  std::__cxx11::string::string((string *)&local_120,"d",&local_124);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&binder.m_arg.shortNames,&local_120);
  std::__cxx11::string::string((string *)&local_e0,"durations",&local_121);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.longName);
  std::__cxx11::string::string(local_c0,"yes/no",&local_122);
  std::__cxx11::string::_M_assign((string *)&binder.m_arg.hint);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_100);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&binder);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        Clara::CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli.bind( &ConfigData::showHelp )
            .describe( "display usage information" )
            .shortOpt( "?")
            .shortOpt( "h")
            .longOpt( "help" );

        cli.bind( &ConfigData::listTests )
            .describe( "list all (or matching) test cases" )
            .shortOpt( "l")
            .longOpt( "list-tests" );

        cli.bind( &ConfigData::listTags )
            .describe( "list all (or matching) tags" )
            .shortOpt( "t")
            .longOpt( "list-tags" );

        cli.bind( &ConfigData::listReporters )
            .describe( "list all reporters" )
            .longOpt( "list-reporters" );

        cli.bind( &ConfigData::showSuccessfulTests )
            .describe( "include successful tests in output" )
            .shortOpt( "s")
            .longOpt( "success" );

        cli.bind( &ConfigData::shouldDebugBreak )
            .describe( "break into debugger on failure" )
            .shortOpt( "b")
            .longOpt( "break" );

        cli.bind( &ConfigData::noThrow )
            .describe( "skip exception tests" )
            .shortOpt( "e")
            .longOpt( "nothrow" );

        cli.bind( &ConfigData::outputFilename )
            .describe( "output filename" )
            .shortOpt( "o")
            .longOpt( "out" )
            .hint( "filename" );

        cli.bind( &ConfigData::reporterName )
            .describe( "reporter to use - defaults to console" )
            .shortOpt( "r")
            .longOpt( "reporter" )
//            .hint( "name[:filename]" );
            .hint( "name" );

        cli.bind( &ConfigData::name )
            .describe( "suite name" )
            .shortOpt( "n")
            .longOpt( "name" )
            .hint( "name" );

        cli.bind( &abortAfterFirst )
            .describe( "abort at first failure" )
            .shortOpt( "a")
            .longOpt( "abort" );

        cli.bind( &abortAfterX )
            .describe( "abort after x failures" )
            .shortOpt( "x")
            .longOpt( "abortx" )
            .hint( "number of failures" );

        cli.bind( &addWarning )
            .describe( "enable warnings" )
            .shortOpt( "w")
            .longOpt( "warn" )
            .hint( "warning name" );

//        cli.bind( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .hint( "level" );

        cli.bind( &addTestOrTags )
            .describe( "which test or tests to use" )
            .hint( "test name, pattern or tags" );

        cli.bind( &setShowDurations )
            .describe( "show test durations" )
            .shortOpt( "d")
            .longOpt( "durations" )
            .hint( "yes/no" );

        return cli;
    }